

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

bool ConsiderPatches(char *arg)

{
  uint uVar1;
  char *patchfile;
  ulong uVar2;
  ulong uVar3;
  FString *args;
  
  uVar1 = DArgs::CheckParmList(Args,arg,&args,1);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    patchfile = BaseFileSearch(args[uVar2].Chars,".deh",false);
    if ((patchfile != (char *)0x0) ||
       (patchfile = BaseFileSearch(args[uVar2].Chars,".bex",false), patchfile != (char *)0x0)) {
      D_LoadDehFile(patchfile);
    }
  }
  return 0 < (int)uVar1;
}

Assistant:

bool ConsiderPatches (const char *arg)
{
	int i, argc;
	FString *args;
	const char *f;

	argc = Args->CheckParmList(arg, &args);
	for (i = 0; i < argc; ++i)
	{
		if ( (f = BaseFileSearch(args[i], ".deh")) ||
			 (f = BaseFileSearch(args[i], ".bex")) )
		{
			D_LoadDehFile(f);
		}
	}
	return argc > 0;
}